

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O3

void __thiscall Jupiter::Plugin::setConfigDirectory(Plugin *this,string_view dir)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&plugin_configs_directory_abi_cxx11_,0,
             plugin_configs_directory_abi_cxx11_._M_string_length,(char *)dir._M_len,(size_type)this
            );
  if ((plugin_configs_directory_abi_cxx11_._M_string_length != 0) &&
     (plugin_configs_directory_abi_cxx11_._M_dataplus._M_p
      [plugin_configs_directory_abi_cxx11_._M_string_length - 1] != '/')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&plugin_configs_directory_abi_cxx11_,'/');
    return;
  }
  return;
}

Assistant:

void Jupiter::Plugin::setConfigDirectory(std::string_view dir) {
	plugin_configs_directory = dir;
	if (!plugin_configs_directory.empty() && plugin_configs_directory.back() != directory_character) {
		plugin_configs_directory += directory_character;
	}
}